

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O3

size_t __thiscall
duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS::Process
          (AESStateMBEDTLS *this,const_data_ptr_t in,idx_t in_len,data_ptr_t out,idx_t out_len)

{
  int iVar1;
  size_t result;
  size_t local_20;
  runtime_error local_18 [16];
  
  iVar1 = mbedtls_cipher_update
                    ((this->context).
                     super_unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                     ._M_t.
                     super___uniq_ptr_impl<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_mbedtls_cipher_context_t_*,_std::default_delete<mbedtls_cipher_context_t>_>
                     .super__Head_base<0UL,_mbedtls_cipher_context_t_*,_false>._M_head_impl,in,
                     in_len,out,&local_20);
  if (iVar1 != 0) {
    std::runtime_error::runtime_error(local_18,"Encryption or Decryption failed at Process");
    std::runtime_error::~runtime_error(local_18);
  }
  return local_20;
}

Assistant:

void MbedTlsWrapper::SHA1State::AddString(const std::string &str) {
	auto context = reinterpret_cast<mbedtls_sha1_context *>(sha_context);
	if (mbedtls_sha1_update(context, (unsigned char *)str.data(), str.size())) {
		throw std::runtime_error("SHA1 Error");
	}
}